

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy>::
decode_lines(jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *this)

{
  undefined8 *puVar1;
  uint uVar2;
  process_line *ppVar3;
  uint32_t uVar4;
  pixel_type *ppVar5;
  pixel_type *ppVar6;
  pixel_type *ppVar7;
  unsigned_short *__tmp;
  int iVar8;
  size_type sVar9;
  int iVar10;
  long lVar11;
  uint32_t uVar12;
  ulong uVar13;
  size_type __n;
  vector<int,_std::allocator<int>_> run_index;
  vector<unsigned_short,_std::allocator<unsigned_short>_> line_buffer;
  allocator_type local_81;
  uint32_t local_80;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  long local_48;
  long local_40;
  ulong local_38;
  
  uVar13 = (ulong)(this->width_ + 4);
  iVar8 = 1;
  if ((this->super_decoder_strategy).parameters_.interleave_mode == Line) {
    iVar8 = (this->super_decoder_strategy).frame_info_.component_count;
  }
  __n = (size_type)iVar8;
  lVar11 = __n * uVar13;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&local_60,lVar11 * 2,(allocator_type *)&local_78);
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__n,&local_81);
  local_48 = -lVar11;
  uVar12 = 0;
  local_7c = iVar8;
  local_40 = lVar11;
  while( true ) {
    uVar4 = (this->super_decoder_strategy).frame_info_.height;
    uVar2 = uVar4 - uVar12;
    if (this->restart_interval_ < uVar4 - uVar12) {
      uVar2 = this->restart_interval_;
    }
    if (uVar2 != 0) {
      local_80 = uVar2 + uVar12;
      iVar10 = 0;
      local_38 = (ulong)uVar2;
      do {
        ppVar7 = local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start + 1;
        this->previous_line_ = ppVar7;
        ppVar6 = local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_start + local_40 + 1;
        this->current_line_ = ppVar6;
        ppVar5 = ppVar6;
        if ((uVar12 & 1) != 0) {
          this->previous_line_ = ppVar6;
          this->current_line_ = ppVar7;
          ppVar5 = ppVar7;
          ppVar7 = ppVar6;
        }
        if (iVar8 != 0) {
          sVar9 = 0;
          do {
            this->run_index_ =
                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar9];
            ppVar7[this->width_] = ppVar7[this->width_ - 1];
            ppVar5[-1] = *ppVar7;
            do_line(this,(sample_type *)0x0);
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[sVar9] = this->run_index_;
            ppVar7 = this->previous_line_ + uVar13;
            this->previous_line_ = ppVar7;
            ppVar5 = this->current_line_ + uVar13;
            this->current_line_ = ppVar5;
            sVar9 = sVar9 + 1;
          } while (__n != sVar9);
        }
        uVar2 = (this->rect_).Y;
        if ((uVar2 <= uVar12) && (uVar12 < uVar2 + (this->rect_).Height)) {
          ppVar3 = (this->super_decoder_strategy).process_line_._M_t.
                   super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
                   .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
          (*ppVar3->_vptr_process_line[2])
                    (ppVar3,ppVar5 + (this->rect_).X + local_48,(long)(this->rect_).Width,uVar13);
        }
        iVar10 = iVar10 + 1;
        uVar12 = uVar12 + 1;
        iVar8 = local_7c;
      } while (iVar10 != (int)local_38);
      uVar4 = (this->super_decoder_strategy).frame_info_.height;
      uVar12 = local_80;
    }
    if (uVar12 == uVar4) break;
    read_restart_marker(this);
    this->restart_interval_counter_ = this->restart_interval_counter_ + 1 & 7;
    decoder_strategy::reset(&this->super_decoder_strategy);
    if (local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      memset(local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start,0,
             ((long)local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
              (-2 - (long)local_60.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffeU) + 2);
    }
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      memset(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,0,
             ((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish +
              (-4 - (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) & 0xfffffffffffffffcU) + 4);
    }
    lVar11 = 0x90;
    do {
      puVar1 = (undefined8 *)((long)&(this->super_decoder_strategy)._vptr_decoder_strategy + lVar11)
      ;
      *puVar1 = 0x40;
      puVar1[1] = 0x100000000;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x1760);
    (this->context_run_mode_)._M_elems[0].run_interruption_type_ = 0;
    (this->context_run_mode_)._M_elems[0].a_ = 0x40;
    (this->context_run_mode_)._M_elems[0].n_ = '\x01';
    (this->context_run_mode_)._M_elems[0].nn_ = '\0';
    (this->context_run_mode_)._M_elems[1].run_interruption_type_ = 1;
    (this->context_run_mode_)._M_elems[1].a_ = 0x40;
    (this->context_run_mode_)._M_elems[1].n_ = '\x01';
    (this->context_run_mode_)._M_elems[1].nn_ = '\0';
    this->run_index_ = 0;
  }
  decoder_strategy::end_scan(&this->super_decoder_strategy);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void decode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{};;)
        {
            const uint32_t lines_in_interval{std::min(frame_info().height - line, restart_interval_)};

            for (uint32_t mcu{}; mcu < lines_in_interval; ++mcu, ++line)
            {
                previous_line_ = &line_buffer[1];
                current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
                if ((line & 1) == 1)
                {
                    std::swap(previous_line_, current_line_);
                }

                for (size_t component{}; component < component_count; ++component)
                {
                    run_index_ = run_index[component];

                    // initialize edge pixels used for prediction
                    previous_line_[width_] = previous_line_[width_ - 1];
                    current_line_[-1] = previous_line_[0];
                    do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                    run_index[component] = run_index_;
                    previous_line_ += pixel_stride;
                    current_line_ += pixel_stride;
                }

                // Only copy the line if it is part of the output rectangle.
                if (static_cast<uint32_t>(rect_.Y) <= line && line < static_cast<uint32_t>(rect_.Y + rect_.Height))
                {
                    Strategy::on_line_end(current_line_ + rect_.X - (static_cast<size_t>(component_count) * pixel_stride),
                                          rect_.Width,
                                          pixel_stride);
                }
            }

            if (line == frame_info().height)
                break;

            // At this point in the byte stream a restart marker should be present: process it.
            read_restart_marker();
            restart_interval_counter_ = (restart_interval_counter_ + 1) % jpeg_restart_marker_range;

            // After a restart marker it is required to reset the decoder.
            Strategy::reset();
            std::fill(line_buffer.begin(), line_buffer.end(), pixel_type{});
            std::fill(run_index.begin(), run_index.end(), 0);
            reset_parameters();
        }

        Strategy::end_scan();
    }